

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O0

void __thiscall
geometrycentral::MarkedDisjointSets::MarkedDisjointSets(MarkedDisjointSets *this,size_t n_)

{
  ulong uVar1;
  size_type __n;
  reference pvVar2;
  ulong in_RSI;
  ulong *in_RDI;
  reference rVar3;
  size_t i;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  allocator_type *in_stack_ffffffffffffff70;
  vector<bool,_std::allocator<bool>_> *this_00;
  size_type in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  vector<bool,_std::allocator<bool>_> *this_01;
  reference local_40;
  ulong local_30;
  
  *in_RDI = in_RSI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x39b958);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x39b97b);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x39b9a9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x39b9cc);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 7);
  __n = *in_RDI + 1;
  this_01 = (vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffffda;
  std::allocator<bool>::allocator((allocator<bool> *)0x39b9fa);
  std::vector<bool,_std::allocator<bool>_>::vector
            (this_00,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<bool>::~allocator((allocator<bool> *)0x39ba1d);
  for (local_30 = 0; local_30 <= *in_RDI; local_30 = local_30 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 4),
                        local_30);
    uVar1 = local_30;
    *pvVar2 = 0;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 1),
                        local_30);
    *pvVar2 = uVar1;
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n);
    local_40 = rVar3;
    std::_Bit_reference::operator=(&local_40,false);
  }
  return;
}

Assistant:

MarkedDisjointSets::MarkedDisjointSets(size_t n_) : n(n_), parent(n + 1), rank(n + 1), marked(n + 1) {
  // Initialize all elements to be in different sets and to have rank 0
  for (size_t i = 0; i <= n; i++) {
    rank[i] = 0;
    parent[i] = i;
    marked[i] = false;
  }
}